

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
RefundIRCCommand::trigger
          (RefundIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  size_t sVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  ulong uVar5;
  PlayerInfo *pPVar6;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  double dVar10;
  string msg;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  split_parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar8 = nick._M_str;
  sVar7 = nick._M_len;
  msg._M_dataplus._M_p = (pointer)parameters._M_len;
  msg._M_string_length = (size_type)parameters._M_str;
  local_50._M_dataplus._M_p = (pointer)0x2;
  local_50._M_string_length = 0x13bb6d;
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&split_parameters,(basic_string_view<char,_std::char_traits<char>_> *)&msg,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  if ((ulong)((long)split_parameters.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)split_parameters.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
    Jupiter::IRC::Client::sendNotice
              (source,sVar7,pcVar8,0x3b,
               "Error: Too Few Parameters. Syntax: refund <player> <amount>");
  }
  else {
    lVar4 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar4 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      sVar1 = (split_parameters.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_len;
      pcVar2 = (split_parameters.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_str;
      dVar10 = (double)Jupiter_strtod_s(split_parameters.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1]._M_str,
                                        split_parameters.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1]._M_len);
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      msg._M_string_length = 0;
      msg.field_2._M_local_buf[0] = '\0';
      uVar9 = 0;
      while( true ) {
        RenX::getCore();
        uVar5 = RenX::Core::getServerCount();
        if (uVar5 == uVar9) break;
        uVar5 = RenX::getCore();
        pPVar6 = (PlayerInfo *)RenX::Core::getServer(uVar5);
        cVar3 = RenX::Server::isLogChanType((int)pPVar6);
        if ((cVar3 != '\0') && (*(long *)((long)&(pPVar6->name).field_2 + 8) != 0)) {
          lVar4 = RenX::Server::getPlayerByPartName(pPVar6,sVar1,pcVar2);
          if (lVar4 != 0) {
            cVar3 = RenX::Server::giveCredits(pPVar6,dVar10);
            if (cVar3 == '\0') {
              s_abi_cxx11_(&local_50,"Error: Server does not support refunds.",0x27);
            }
            else {
              string_printf_abi_cxx11_
                        (&local_50,"You have been refunded %.0f credits by %.*s.",SUB84(dVar10,0),
                         sVar7,pcVar8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&msg,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              RenX::Server::sendMessage(pPVar6,lVar4,msg._M_string_length,msg._M_dataplus._M_p);
              string_printf_abi_cxx11_
                        (&local_50,"%.*s has been refunded %.0f credits.",SUB84(dVar10,0),
                         *(undefined8 *)(lVar4 + 0x10),*(undefined8 *)(lVar4 + 8));
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&msg,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            Jupiter::IRC::Client::sendMessage
                      (source,channel._M_len,channel._M_str,msg._M_string_length,
                       msg._M_dataplus._M_p);
          }
        }
        uVar9 = uVar9 + 1;
      }
      if (msg._M_string_length == 0) {
        Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar8,0x18,"Error: Player not found.");
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&split_parameters.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return;
}

Assistant:

void RefundIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	std::vector<std::string_view> split_parameters = jessilib::word_split_view(std::string_view{parameters}, WHITESPACE_SV);
	if (split_parameters.size() >= 2) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string_view playerName = split_parameters[0];
			double credits = Jupiter::asDouble(split_parameters[1]);
			RenX::PlayerInfo *player;
			std::string msg;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					player = server->getPlayerByPartName(playerName);
					if (player != nullptr) {
						if (server->giveCredits(*player, credits)) {
							msg = string_printf("You have been refunded %.0f credits by %.*s.", credits, nick.size(), nick.data());
							server->sendMessage(*player, msg);
							msg = string_printf("%.*s has been refunded %.0f credits.", player->name.size(), player->name.data(), credits);
						}
						else {
							msg = "Error: Server does not support refunds."s;
						}
						source->sendMessage(channel, msg);
					}
				}
			}
			if (msg.empty()) {
				source->sendNotice(nick, "Error: Player not found."sv);
			}
		}
	}
	else {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: refund <player> <amount>"sv);
	}
}